

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCode(Parse *pParse,Expr *pExpr,int target)

{
  int p1;
  int inReg;
  int target_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  if ((pExpr == (Expr *)0x0) || (pExpr->op != 0xa8)) {
    p1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
    if ((p1 != target) && (pParse->pVdbe != (Vdbe *)0x0)) {
      sqlite3VdbeAddOp2(pParse->pVdbe,0x4f,p1,target);
    }
  }
  else {
    sqlite3VdbeAddOp2(pParse->pVdbe,0x4e,pExpr->iTable,target);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCode(Parse *pParse, Expr *pExpr, int target){
  int inReg;

  assert( target>0 && target<=pParse->nMem );
  if( pExpr && pExpr->op==TK_REGISTER ){
    sqlite3VdbeAddOp2(pParse->pVdbe, OP_Copy, pExpr->iTable, target);
  }else{
    inReg = sqlite3ExprCodeTarget(pParse, pExpr, target);
    assert( pParse->pVdbe!=0 || pParse->db->mallocFailed );
    if( inReg!=target && pParse->pVdbe ){
      sqlite3VdbeAddOp2(pParse->pVdbe, OP_SCopy, inReg, target);
    }
  }
}